

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpaintengine_pic.cpp
# Opt level: O0

void __thiscall QPicturePaintEngine::updateBrushOrigin(QPicturePaintEngine *this,QPointF *p)

{
  long lVar1;
  undefined4 uVar2;
  QPicturePaintEnginePrivate *pQVar3;
  QPointF *in_RSI;
  QRect *in_RDI;
  long in_FS_OFFSET;
  int pos;
  QPicturePaintEnginePrivate *d;
  undefined8 in_stack_ffffffffffffff88;
  quint8 i;
  undefined4 in_stack_ffffffffffffff98;
  undefined1 in_stack_ffffffffffffffcf;
  QRectF *in_stack_ffffffffffffffd0;
  int in_stack_ffffffffffffffdc;
  QPicturePaintEngine *in_stack_ffffffffffffffe0;
  
  i = (quint8)((ulong)in_stack_ffffffffffffff88 >> 0x38);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar3 = d_func((QPicturePaintEngine *)0x31028f);
  pQVar3->pic_d->trecs = pQVar3->pic_d->trecs + 1;
  QDataStream::operator<<((QDataStream *)in_RDI,i);
  QDataStream::operator<<((QDataStream *)in_RDI,i);
  uVar2 = QBuffer::pos();
  ::operator<<(&pQVar3->s,in_RSI);
  QRect::QRect(in_RDI);
  QRectF::QRectF((QRectF *)&stack0xffffffffffffffd8,
                 (QRect *)CONCAT44(uVar2,in_stack_ffffffffffffff98));
  writeCmdLength(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd0,
                 (bool)in_stack_ffffffffffffffcf);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QPicturePaintEngine::updateBrushOrigin(const QPointF &p)
{
    Q_D(QPicturePaintEngine);
#ifdef QT_PICTURE_DEBUG
    qDebug() << " -> updateBrushOrigin(): " << p;
#endif
    int pos;
    SERIALIZE_CMD(QPicturePrivate::PdcSetBrushOrigin);
    d->s << p;
    writeCmdLength(pos, QRect(), false);
}